

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (CompilerGLSL *this,TextureFunctionArguments *args,bool *p_forward)

{
  undefined8 type_00;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  char *pcVar4;
  CompilerError *this_00;
  char in_RCX [8];
  uint32_t id;
  bool local_7b7;
  bool local_7b5;
  bool local_7b3;
  bool local_7b1;
  bool local_7a6;
  bool local_7a3;
  bool local_7a1;
  bool local_782;
  bool local_771;
  undefined1 local_728 [32];
  undefined1 local_708 [32];
  undefined1 local_6e8 [32];
  undefined1 local_6c8 [32];
  undefined1 local_6a8 [32];
  undefined1 local_688 [32];
  undefined1 local_668 [32];
  undefined1 local_648 [32];
  undefined1 local_628 [64];
  SPIRType *local_5e8;
  SPIRType *lod_expr_type;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [40];
  SPIRType type;
  string local_408 [32];
  undefined1 local_3e8 [64];
  undefined1 local_3a8 [32];
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 local_308 [32];
  undefined1 local_2e8 [64];
  undefined1 local_2a8 [32];
  undefined1 local_288 [40];
  undefined1 local_260 [7];
  bool workaround_lod_array_shadow_as_grad;
  undefined1 local_240 [8];
  SPIRType expected_type;
  SPIRType *coord_type;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  char *swizzle_expr;
  undefined1 local_90 [5];
  bool forward;
  anon_class_1_1_ecf36ffc swizzle;
  bool swizz_func;
  undefined1 local_60 [48];
  SPIRType *imgtype;
  AlignedBuffer<unsigned_char,_8UL> AStack_28;
  VariableID img;
  bool *p_forward_local;
  TextureFunctionArguments *args_local;
  CompilerGLSL *this_local;
  string *farg_str;
  
  imgtype._4_4_ = *(undefined4 *)p_forward;
  local_60._40_8_ = *(undefined8 *)(p_forward + 8);
  local_60[0x27] = '\0';
  AStack_28.aligned_char = in_RCX;
  ::std::__cxx11::string::string((string *)this);
  id = (uint32_t)args;
  if ((p_forward[0x10] & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    to_expression_abi_cxx11_((CompilerGLSL *)local_90,id,SUB41(uVar2,0));
    ::std::__cxx11::string::operator=((string *)this,(string *)local_90);
    ::std::__cxx11::string::~string((string *)local_90);
  }
  else {
    TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    convert_separate_image_to_expression_abi_cxx11_((CompilerGLSL *)local_60,id);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  swizzle_expr._6_1_ = *(byte *)&args[0x66].base.imgtype & 1;
  swizzle_expr._7_1_ = swizzle_expr._6_1_;
  swizzle_expr._5_1_ = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x18));
  uVar2 = *(uint32_t *)(p_forward + 0x1c);
  pSVar3 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
  pcVar4 = to_function_args::anon_class_1_1_ecf36ffc::operator()
                     ((anon_class_1_1_ecf36ffc *)((long)&swizzle_expr + 6),uVar2,pSVar3->vecsize);
  if (*pcVar4 == '\0') {
    to_expression_abi_cxx11_((CompilerGLSL *)local_c0,id,SUB41(*(undefined4 *)(p_forward + 0x18),0))
    ;
  }
  else {
    to_enclosed_expression_abi_cxx11_
              ((CompilerGLSL *)local_e0,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     local_e0);
    ::std::__cxx11::string::~string((string *)local_e0);
  }
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
  if (*(int *)&(((SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket)->super_IVariant)
               .field_0xc == 8) {
    SPIRType::SPIRType((SPIRType *)local_240,
                       (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
    expected_type.super_IVariant._12_1_ = p_forward[0x1c];
    expected_type.super_IVariant._13_1_ = p_forward[0x1d];
    expected_type.super_IVariant._14_1_ = p_forward[0x1e];
    expected_type.super_IVariant._15_1_ = p_forward[0x1f];
    expected_type.super_IVariant._vptr_IVariant._4_4_ = 7;
    bitcast_expression((CompilerGLSL *)local_260,(SPIRType *)args,(BaseType)local_240,
                       (string *)
                       (ulong)*(uint *)((long)&expected_type.member_name_cache._M_h._M_single_bucket
                                               [1]._M_nxt + 4));
    ::std::__cxx11::string::operator=((string *)local_c0,(string *)local_260);
    ::std::__cxx11::string::~string((string *)local_260);
    SPIRType::~SPIRType((SPIRType *)local_240);
  }
  type_00 = local_60._40_8_;
  if ((((((bool *)(local_60._40_8_ + 0x100))[1] & 1U) != 0) &&
      (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim2D)) ||
     (local_771 = false, ((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimCube)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    bVar1 = Compiler::image_is_comparison((Compiler *)args,(SPIRType *)type_00,uVar2);
    local_771 = false;
    if (bVar1) {
      local_771 = *(int *)(p_forward + 0x2c) != 0;
    }
  }
  local_288[0x27] = local_771;
  if (*(int *)(p_forward + 0x20) == 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
  }
  else {
    local_782 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_782 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x20));
    }
    swizzle_expr._5_1_ = local_782;
    if (((p_forward[0x11] & 1U) == 0) && (*(int *)(p_forward + 0x1c) != 4)) {
      if ((p_forward[0x12] & 1U) == 0) {
        pSVar3 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
        SPIRType::SPIRType((SPIRType *)(local_580 + 0x20),pSVar3);
        type.super_IVariant._12_4_ = *(int *)(p_forward + 0x1c) + 1;
        ::std::__cxx11::string::operator+=((string *)this,", ");
        type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_580,(SPIRType *)args);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_580);
        ::std::__cxx11::string::~string((string *)local_580);
        ::std::__cxx11::string::operator+=((string *)this,"(");
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
        ::std::__cxx11::string::operator+=((string *)this,", ");
        to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_5a0,id,SUB41(*(undefined4 *)(p_forward + 0x20),0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_5a0);
        ::std::__cxx11::string::~string((string *)local_5a0);
        ::std::__cxx11::string::operator+=((string *)this,")");
        SPIRType::~SPIRType((SPIRType *)(local_580 + 0x20));
      }
      else {
        ::std::__cxx11::string::operator+=((string *)this,", vec4(");
        if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim1D) {
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_2e8,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_2e8 + 0x20),local_2e8);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_2e8 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_2e8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          ::std::__cxx11::string::operator+=((string *)this,"0.0, ");
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_308,id,SUB41(*(undefined4 *)(p_forward + 0x20),0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_308);
          ::std::__cxx11::string::~string((string *)local_308);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_348,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_348 + 0x20),local_348);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_348 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_348 + 0x20));
          ::std::__cxx11::string::~string((string *)local_348);
        }
        else {
          if (((ImageType *)(local_60._40_8_ + 0xf8))->dim != Dim2D) {
            type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_408,"Invalid type for textureProj with shadow.",
                       (allocator *)((long)&type.member_name_cache._M_h._M_single_bucket + 7));
            CompilerError::CompilerError(this_00,(string *)local_408);
            type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_388,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x20),local_388);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_388 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_388 + 0x20));
          ::std::__cxx11::string::~string((string *)local_388);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_3a8,id,SUB41(*(undefined4 *)(p_forward + 0x20),0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3a8);
          ::std::__cxx11::string::~string((string *)local_3a8);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_3e8,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_3e8 + 0x20),local_3e8);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_3e8 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_3e8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_3e8);
        }
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)this,", ");
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_288,id,SUB41(*(undefined4 *)(p_forward + 0x18),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_288);
      ::std::__cxx11::string::~string((string *)local_288);
      ::std::__cxx11::string::operator+=((string *)this,", ");
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_2a8,id,SUB41(*(undefined4 *)(p_forward + 0x20),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_2a8);
      ::std::__cxx11::string::~string((string *)local_2a8);
    }
  }
  if ((*(int *)(p_forward + 0x24) != 0) || (*(int *)(p_forward + 0x28) != 0)) {
    local_7a1 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_7a1 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x24));
    }
    swizzle_expr._5_1_ = local_7a1;
    local_7a3 = false;
    if (local_7a1 != false) {
      local_7a3 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x28));
    }
    swizzle_expr._5_1_ = local_7a3;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_5c0,id,SUB41(*(undefined4 *)(p_forward + 0x24),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_5c0);
    ::std::__cxx11::string::~string((string *)local_5c0);
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)&lod_expr_type,id,SUB41(*(undefined4 *)(p_forward + 0x28),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)&lod_expr_type);
    ::std::__cxx11::string::~string((string *)&lod_expr_type);
  }
  if (*(int *)(p_forward + 0x2c) == 0) {
    if ((((p_forward[0x10] & 1U) != 0) &&
        (((ImageType *)(local_60._40_8_ + 0xf8))->dim != DimBuffer)) &&
       ((((bool *)(local_60._40_8_ + 0x100))[2] & 1U) == 0)) {
      ::std::__cxx11::string::operator+=((string *)this,", 0");
    }
  }
  else if ((local_288[0x27] & 1) == 0) {
    bVar1 = check_explicit_lod_allowed((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x2c));
    if (bVar1) {
      local_7a6 = false;
      if ((swizzle_expr._5_1_ & 1) != 0) {
        local_7a6 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x2c));
      }
      swizzle_expr._5_1_ = local_7a6;
      ::std::__cxx11::string::operator+=((string *)this,", ");
      local_5e8 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x2c));
      if ((((p_forward[0x10] & 1U) == 0) ||
          (((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimBuffer)) ||
         (((((bool *)(local_60._40_8_ + 0x100))[2] & 1U) != 0 ||
          (*(int *)&(local_5e8->super_IVariant).field_0xc == 7)))) {
        to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_648,id,SUB41(*(undefined4 *)(p_forward + 0x2c),0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_648);
        ::std::__cxx11::string::~string((string *)local_648);
      }
      else {
        to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_628,id,SUB41(*(undefined4 *)(p_forward + 0x2c),0));
        join<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_628 + 0x20),(char (*) [5])0x4e03a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                   (char (*) [2])0x4dff7a);
        ::std::__cxx11::string::operator+=((string *)this,(string *)(local_628 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_628 + 0x20));
        ::std::__cxx11::string::~string((string *)local_628);
      }
    }
  }
  else if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim2D) {
    ::std::__cxx11::string::operator+=((string *)this,", vec2(0.0), vec2(0.0)");
  }
  else if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimCube) {
    ::std::__cxx11::string::operator+=((string *)this,", vec3(0.0), vec3(0.0)");
  }
  if (*(int *)(p_forward + 0x30) == 0) {
    if (*(int *)(p_forward + 0x34) != 0) {
      local_7b3 = false;
      if ((swizzle_expr._5_1_ & 1) != 0) {
        local_7b3 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x34));
      }
      swizzle_expr._5_1_ = local_7b3;
      ::std::__cxx11::string::operator+=((string *)this,", ");
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_688,id,SUB41(*(undefined4 *)(p_forward + 0x34),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_688);
      ::std::__cxx11::string::~string((string *)local_688);
    }
  }
  else {
    local_7b1 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_7b1 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x30));
    }
    swizzle_expr._5_1_ = local_7b1;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_668,id,SUB41(*(undefined4 *)(p_forward + 0x30),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_668);
    ::std::__cxx11::string::~string((string *)local_668);
  }
  if (*(int *)(p_forward + 0x40) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_6a8,id,SUB41(*(undefined4 *)(p_forward + 0x40),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_6a8);
    ::std::__cxx11::string::~string((string *)local_6a8);
  }
  if (*(int *)(p_forward + 0x48) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_6c8,id,SUB41(*(undefined4 *)(p_forward + 0x48),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_6c8);
    ::std::__cxx11::string::~string((string *)local_6c8);
  }
  if (*(int *)(p_forward + 0x44) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_6e8,id,SUB41(*(undefined4 *)(p_forward + 0x44),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_6e8);
    ::std::__cxx11::string::~string((string *)local_6e8);
  }
  if (*(int *)(p_forward + 0x38) != 0) {
    local_7b5 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_7b5 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x38));
    }
    swizzle_expr._5_1_ = local_7b5;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_708,id,SUB41(*(undefined4 *)(p_forward + 0x38),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_708);
    ::std::__cxx11::string::~string((string *)local_708);
  }
  if (*(int *)(p_forward + 0x3c) != 0) {
    local_7b7 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_7b7 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x3c));
    }
    swizzle_expr._5_1_ = local_7b7;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_728,id,SUB41(*(undefined4 *)(p_forward + 0x3c),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_728);
    ::std::__cxx11::string::~string((string *)local_728);
  }
  *(byte *)AStack_28.aligned_char = swizzle_expr._5_1_ & 1;
  local_60[0x27] = 1;
  ::std::__cxx11::string::~string((string *)local_c0);
  if ((local_60[0x27] & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_expression(img);

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    image_is_comparison(imgtype, img) && args.lod != 0;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";
			farg_str += coord_expr;
			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			if (check_explicit_lod_allowed(args.lod))
			{
				forward = forward && should_forward(args.lod);
				farg_str += ", ";

				auto &lod_expr_type = expression_type(args.lod);

				// Lod expression for TexelFetch in GLSL must be int, and only int.
				if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms &&
				    lod_expr_type.basetype != SPIRType::Int)
				{
					farg_str += join("int(", to_expression(args.lod), ")");
				}
				else
				{
					farg_str += to_expression(args.lod);
				}
			}
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += to_expression(args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += to_expression(args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component)
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += to_expression(args.component);
	}

	*p_forward = forward;

	return farg_str;
}